

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_349b6b::HandleRelativePathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *in_name;
  string *in_name_00;
  pointer pbVar1;
  bool bVar2;
  string_view value;
  string res;
  allocator<char> local_49;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x80) {
    in_name = pbVar1 + 2;
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar2) {
      in_name_00 = pbVar1 + 3;
      bVar2 = cmsys::SystemTools::FileIsFullPath(in_name_00);
      if (bVar2) {
        cmSystemTools::RelativePath(&local_48,in_name,in_name_00);
        value._M_str = local_48._M_dataplus._M_p;
        value._M_len = local_48._M_string_length;
        cmMakefile::AddDefinition(status->Makefile,pbVar1 + 1,value);
        std::__cxx11::string::~string((string *)&local_48);
        return true;
      }
      std::operator+(&local_48,"RELATIVE_PATH must be passed a full path to the file: ",in_name_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      std::operator+(&local_48,"RELATIVE_PATH must be passed a full path to the directory: ",in_name
                    );
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"RELATIVE_PATH called with incorrect number of arguments",
               &local_49);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return false;
}

Assistant:

bool HandleRelativePathCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  if (args.size() != 4) {
    status.SetError("RELATIVE_PATH called with incorrect number of arguments");
    return false;
  }

  const std::string& outVar = args[1];
  const std::string& directoryName = args[2];
  const std::string& fileName = args[3];

  if (!cmSystemTools::FileIsFullPath(directoryName)) {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the directory: " +
      directoryName;
    status.SetError(errstring);
    return false;
  }
  if (!cmSystemTools::FileIsFullPath(fileName)) {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the file: " + fileName;
    status.SetError(errstring);
    return false;
  }

  std::string res = cmSystemTools::RelativePath(directoryName, fileName);
  status.GetMakefile().AddDefinition(outVar, res);
  return true;
}